

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession.c
# Opt level: O3

int mg_session_flush_chunk(mg_session *session)

{
  size_t len;
  ushort *buf;
  int iVar1;
  ulong uVar2;
  
  len = session->out_end;
  uVar2 = len - session->out_begin;
  iVar1 = 0;
  if (uVar2 != 0) {
    if (0xffff < uVar2) {
      abort();
    }
    buf = (ushort *)session->out_buffer;
    *buf = (ushort)uVar2 << 8 | (ushort)uVar2 >> 8;
    iVar1 = mg_transport_send(session->transport,(char *)buf,len);
    if (iVar1 == 0) {
      session->out_end = session->out_begin;
      iVar1 = 0;
    }
    else {
      mg_session_set_error(session,"failed to send chunk data");
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int mg_session_flush_chunk(mg_session *session) {
  size_t chunk_size = session->out_end - session->out_begin;
  if (!chunk_size) {
    return 0;
  }
  if (chunk_size > MG_BOLT_MAX_CHUNK_SIZE) {
    abort();
  }

  // Actual chunk data is written with offset of two bytes, leaving 2 bytes for
  // chunk size which we write here before sending.
  assert(session->out_begin == MG_BOLT_CHUNK_HEADER_SIZE);
  assert(MG_BOLT_CHUNK_HEADER_SIZE == sizeof(uint16_t));

  *(uint16_t *)session->out_buffer = htobe16((uint16_t)chunk_size);

  if (mg_transport_send(session->transport, session->out_buffer,
                        session->out_end) != 0) {
    mg_session_set_error(session, "failed to send chunk data");
    return MG_ERROR_SEND_FAILED;
  }

  session->out_end = session->out_begin;
  return 0;
}